

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O0

void cleanup_mon_base(void)

{
  monster_base *pmVar1;
  monster_base *next;
  monster_base *rb;
  
  next = rb_info;
  while (next != (monster_base *)0x0) {
    pmVar1 = next->next;
    string_free(next->text);
    string_free(next->name);
    mem_free(next);
    next = pmVar1;
  }
  return;
}

Assistant:

static void cleanup_mon_base(void)
{
	struct monster_base *rb, *next;

	rb = rb_info;
	while (rb) {
		next = rb->next;
		string_free(rb->text);
		string_free(rb->name);
		mem_free(rb);
		rb = next;
	}
}